

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

uint8_t * find_metadata(uint8_t *file_content,ssize_t file_size,uint32_t *metadata_size)

{
  void *pvVar1;
  uint8_t *local_58;
  uint8_t *tmp;
  uint8_t *start;
  uint8_t *search_area;
  ssize_t max_size;
  ssize_t marker_len;
  uint32_t *metadata_size_local;
  ssize_t file_size_local;
  uint8_t *file_content_local;
  
  local_58 = (uint8_t *)file_size;
  if (0x20000 < file_size) {
    local_58 = (uint8_t *)0x20000;
  }
  search_area = local_58;
  if ((long)local_58 < 0) {
    file_content_local = (uint8_t *)0x0;
  }
  else {
    start = file_content + (file_size - (long)local_58);
    while (pvVar1 = mmdb_memmem(start,(size_t)search_area,anon_var_dwarf_c36,0xe),
          pvVar1 != (void *)0x0) {
      search_area = search_area + (-0xe - ((long)pvVar1 - (long)start));
      start = (uint8_t *)((long)pvVar1 + 0xe);
    }
    if (start == file_content + (file_size - (long)local_58)) {
      file_content_local = (uint8_t *)0x0;
    }
    else {
      *metadata_size = (uint32_t)search_area;
      file_content_local = start;
    }
  }
  return file_content_local;
}

Assistant:

static const uint8_t *find_metadata(const uint8_t *file_content,
                                    ssize_t file_size,
                                    uint32_t *metadata_size) {
    const ssize_t marker_len = sizeof(METADATA_MARKER) - 1;
    ssize_t max_size = file_size > METADATA_BLOCK_MAX_SIZE
                           ? METADATA_BLOCK_MAX_SIZE
                           : file_size;
    if (max_size < 0) {
        return NULL;
    }

    uint8_t const *search_area = (file_content + (file_size - max_size));
    uint8_t const *start = search_area;
    uint8_t const *tmp;
    do {
        tmp = mmdb_memmem(
            search_area, (size_t)max_size, METADATA_MARKER, marker_len);

        if (NULL != tmp) {
            max_size -= tmp - search_area;
            search_area = tmp;

            /* Continue searching just after the marker we just read, in case
             * there are multiple markers in the same file. This would be odd
             * but is certainly not impossible. */
            max_size -= marker_len;
            search_area += marker_len;
        }
    } while (NULL != tmp);

    if (search_area == start) {
        return NULL;
    }

    *metadata_size = (uint32_t)max_size;

    return search_area;
}